

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.hpp
# Opt level: O3

void __thiscall OpenMD::RBCOMVisitor::RBCOMVisitor(RBCOMVisitor *this,SimInfo *info)

{
  (this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName.field_2;
  (this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName._M_string_length = 0;
  (this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseRigidBodyVisitor).info = info;
  (this->super_BaseRigidBodyVisitor).super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__BaseVisitor_002bb5b0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName,0,(char *)0x0,
             0x257114);
  return;
}

Assistant:

RBCOMVisitor(SimInfo* info) : BaseRigidBodyVisitor(info) {
      visitorName = "RBCOMVisitor";
    }